

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_char>,signed_char,duckdb::BitXorOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  byte bVar1;
  unsigned_long *puVar2;
  byte *pbVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  idx_t iVar11;
  byte bVar12;
  unsigned_long uVar13;
  ulong uVar14;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar4 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar6 = 0;
      uVar8 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar13 = 0xffffffffffffffff;
        }
        else {
          uVar13 = puVar2[uVar6];
        }
        uVar10 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar10 = count;
        }
        uVar7 = uVar10;
        if (uVar13 != 0) {
          uVar7 = uVar8;
          if (uVar13 == 0xffffffffffffffff) {
            if (uVar8 < uVar10) {
              bVar12 = *state;
              do {
                bVar1 = pdVar4[uVar7];
                if ((bVar12 & 1) == 0) {
                  state[1] = bVar1;
                  *state = '\x01';
                  bVar12 = 1;
                }
                else {
                  state[1] = state[1] ^ bVar1;
                }
                uVar7 = uVar7 + 1;
              } while (uVar10 != uVar7);
            }
          }
          else if (uVar8 < uVar10) {
            uVar14 = 0;
            do {
              if ((uVar13 >> (uVar14 & 0x3f) & 1) != 0) {
                bVar12 = pdVar4[uVar8];
                if (*state == '\0') {
                  state[1] = bVar12;
                  *state = '\x01';
                }
                else {
                  state[1] = state[1] ^ bVar12;
                }
              }
              uVar8 = uVar8 + 1;
              uVar14 = uVar14 + 1;
              uVar7 = uVar8;
            } while (uVar10 != uVar8);
          }
        }
        uVar6 = uVar6 + 1;
        uVar8 = uVar7;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) && (count != 0)) {
      pbVar3 = input->data;
      do {
        if (*state == '\0') {
          state[1] = *pbVar3;
          *state = '\x01';
        }
        else {
          state[1] = state[1] ^ *pbVar3;
        }
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_68.sel)->sel_vector;
        bVar12 = *state;
        iVar9 = 0;
        do {
          iVar11 = iVar9;
          if (psVar5 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar5[iVar9];
          }
          if ((bVar12 & 1) == 0) {
            state[1] = local_68.data[iVar11];
            *state = '\x01';
            bVar12 = 1;
          }
          else {
            state[1] = state[1] ^ local_68.data[iVar11];
          }
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (count != 0) {
      psVar5 = (local_68.sel)->sel_vector;
      iVar9 = 0;
      do {
        iVar11 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar5[iVar9];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar11 >> 6]
             >> (iVar11 & 0x3f) & 1) != 0) {
          if (*state == '\0') {
            state[1] = local_68.data[iVar11];
            *state = '\x01';
          }
          else {
            state[1] = state[1] ^ local_68.data[iVar11];
          }
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}